

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::enterDirectory(QFileDialogPrivate *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  FileMode FVar3;
  Int IVar4;
  QFileDialog *directory;
  QAbstractItemModel *pQVar5;
  ulong uVar6;
  QStyle *pQVar7;
  Ui_QFileDialog *pUVar8;
  QFileDialog *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  FileMode fileMode;
  QFileDialog *q;
  QString path;
  QModelIndex sourceIndex;
  undefined4 in_stack_ffffffffffffff38;
  ItemFlag in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  QModelIndex *in_stack_ffffffffffffff48;
  QFileDialogPrivate *in_stack_ffffffffffffff50;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_7c;
  undefined4 local_78;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_74 [7];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  directory = q_func(in_RDI);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = QModelIndex::model((QModelIndex *)0x754991);
  if (pQVar5 == (QAbstractItemModel *)in_RDI->proxyModel) {
    mapToSource(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    local_40 = *(undefined1 **)&(in_RSI->super_QDialog).super_QWidget;
    local_38 = *(undefined1 **)&(in_RSI->super_QDialog).super_QWidget.field_0x8;
    local_30 = *(undefined1 **)&(in_RSI->super_QDialog).super_QWidget.super_QPaintDevice;
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QModelIndex *)in_RDI,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  ::QVariant::toString();
  ::QVariant::~QVariant(&local_28);
  bVar1 = QString::isEmpty((QString *)0x754a4a);
  if ((bVar1) || (uVar6 = QFileSystemModel::isDir((QModelIndex *)in_RDI->model), (uVar6 & 1) != 0))
  {
    FVar3 = QFileDialog::fileMode
                      ((QFileDialog *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
    ;
    QFileDialog::setDirectory(in_RSI,(QString *)directory);
    QFileDialog::directoryEntered
              ((QFileDialog *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (FVar3 == Directory) {
      lineEdit((QFileDialogPrivate *)0x754aaa);
      QString::QString((QString *)0x754ab9);
      QLineEdit::setText((QLineEdit *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                         (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QString::~QString((QString *)0x754ad2);
      lineEdit((QFileDialogPrivate *)0x754adc);
      QLineEdit::clear((QLineEdit *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    }
    goto LAB_00754bd4;
  }
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  pUVar8 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                     (&in_RDI->qFileDialogUi);
  iVar2 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x3d,0,pUVar8->treeView);
  if ((iVar2 == 0) ||
     (FVar3 = QFileDialog::fileMode
                        ((QFileDialog *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)),
     FVar3 != ExistingFiles)) {
LAB_00754b74:
    pQVar5 = QModelIndex::model((QModelIndex *)0x754b7e);
    (**(code **)(*(long *)pQVar5 + 0x138))(pQVar5,in_RSI);
    local_7c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff3c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
    in_stack_ffffffffffffff47 = IVar4 != 0;
  }
  else {
    local_78 = QGuiApplication::keyboardModifiers();
    local_74[0].super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff3c);
    bVar1 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)local_74);
    in_stack_ffffffffffffff47 = false;
    if (bVar1) goto LAB_00754b74;
  }
  if ((bool)in_stack_ffffffffffffff47 != false) {
    (**(code **)(*(long *)&(directory->super_QDialog).super_QWidget + 0x1b8))();
  }
LAB_00754bd4:
  QString::~QString((QString *)0x754bde);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::enterDirectory(const QModelIndex &index)
{
    Q_Q(QFileDialog);
    // My Computer or a directory
    QModelIndex sourceIndex = index.model() == proxyModel ? mapToSource(index) : index;
    QString path = sourceIndex.data(QFileSystemModel::FilePathRole).toString();
    if (path.isEmpty() || model->isDir(sourceIndex)) {
        const QFileDialog::FileMode fileMode = q->fileMode();
        q->setDirectory(path);
        emit q->directoryEntered(path);
        if (fileMode == QFileDialog::Directory) {
            // ### find out why you have to do both of these.
            lineEdit()->setText(QString());
            lineEdit()->clear();
        }
    } else {
        // Do not accept when shift-clicking to multi-select a file in environments with single-click-activation (KDE)
        if ((!q->style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, qFileDialogUi->treeView)
             || q->fileMode() != QFileDialog::ExistingFiles || !(QGuiApplication::keyboardModifiers() & Qt::CTRL))
            && index.model()->flags(index) & Qt::ItemIsEnabled) {
            q->accept();
        }
    }
}